

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O1

void __thiscall booster::fork_shared_mutex::shared_lock(fork_shared_mutex *this)

{
  int iVar1;
  int *piVar2;
  system_error *this_00;
  error_category *peVar3;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  pthread_rwlock_rdlock((pthread_rwlock_t *)(this->d).ptr_);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  do {
    iVar1 = fileno((FILE *)((this->d).ptr_)->lock_file);
    iVar1 = fcntl(iVar1,7,&local_38);
    if (iVar1 == 0) {
      return;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  } while (iVar1 == 4);
  pthread_rwlock_unlock((pthread_rwlock_t *)(this->d).ptr_);
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  peVar3 = (error_category *)std::_V2::system_category();
  system::system_error::system_error(this_00,iVar1,peVar3,"fork_shared_mutex: failed to lock");
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void fork_shared_mutex::shared_lock()
	{
		pthread_rwlock_rdlock(&d->lock);
		struct flock lock;
		memset(&lock,0,sizeof(lock));
		lock.l_type=F_RDLCK;
		lock.l_whence=SEEK_SET;
		int res = 0;
		while((res = ::fcntl(fileno(d->lock_file),F_SETLKW,&lock))!=0 && errno==EINTR)
			;
		if(res == 0)
			return;
		int err = errno;
		pthread_rwlock_unlock(&d->lock);
		throw system::system_error(err,system::system_category(),"fork_shared_mutex: failed to lock");
	}